

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonValidFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  JsonParse *pJVar1;
  
  pJVar1 = jsonParseCached(ctx,argv,(sqlite3_context *)0x0);
  pMem = ctx->pOut;
  if ((pMem->flags & 0x9000) != 0) {
    vdbeReleaseAndSetInt64(pMem,(ulong)(pJVar1 != (JsonParse *)0x0));
    return;
  }
  (pMem->u).i = (ulong)(pJVar1 != (JsonParse *)0x0);
  pMem->flags = 4;
  return;
}

Assistant:

static void jsonValidFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  UNUSED_PARAMETER(argc);
  p = jsonParseCached(ctx, argv, 0);
  sqlite3_result_int(ctx, p!=0);
}